

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

int __thiscall ON_3dVector::IsParallelTo(ON_3dVector *this,ON_3dVector *v,double angle_tolerance)

{
  double dVar1;
  double dVar2;
  double cos_tol;
  double cos_angle;
  double ll;
  int rc;
  double angle_tolerance_local;
  ON_3dVector *v_local;
  ON_3dVector *this_local;
  
  ll._4_4_ = 0;
  dVar1 = Length(this);
  dVar2 = Length(v);
  if (0.0 < dVar1 * dVar2) {
    dVar1 = (this->z * v->z + this->x * v->x + this->y * v->y) / (dVar1 * dVar2);
    dVar2 = cos(angle_tolerance);
    if (dVar1 < dVar2) {
      if (dVar1 <= -dVar2) {
        ll._4_4_ = -1;
      }
    }
    else {
      ll._4_4_ = 1;
    }
  }
  return ll._4_4_;
}

Assistant:

int ON_3dVector::IsParallelTo( 
      // returns  1: this and other vectors are and parallel
      //         -1: this and other vectors are anti-parallel
      //          0: this and other vectors are not parallel
      //             or at least one of the vectors is zero
      const ON_3dVector& v,
      double angle_tolerance // (default=ON_DEFAULT_ANGLE_TOLERANCE) radians
      ) const
{
  int rc = 0;
  const double ll = Length()*v.Length();
  if ( ll > 0.0 ) {
    const double cos_angle = (x*v.x + y*v.y + z*v.z)/ll;
    const double cos_tol = cos(angle_tolerance);
    if ( cos_angle >= cos_tol )
      rc = 1;
    else if ( cos_angle <= -cos_tol )
      rc = -1;
  }
  return rc;
}